

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall libchars::command_node::dump(command_node *this,size_t level)

{
  bool bVar1;
  int iVar2;
  debug *pdVar3;
  ulong uVar4;
  double extraout_XMM0_Qa;
  double __x;
  command_node *local_60;
  command_node *n;
  string local_50 [55];
  allocator<char> local_19;
  size_t local_18;
  size_t level_local;
  command_node *this_local;
  
  local_18 = level;
  level_local = (size_t)this;
  pdVar3 = debug::initialize(0);
  bVar1 = debug::check_level(pdVar3,3);
  if (bVar1) {
    if ((dump(unsigned_long)::indent_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(), iVar2 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dump(unsigned_long)::indent_abi_cxx11_,
                 "                                     ",&local_19);
      std::allocator<char>::~allocator(&local_19);
      __cxa_atexit(std::__cxx11::string::~string,&dump(unsigned_long)::indent_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release();
    }
    pdVar3 = debug::initialize(0);
    bVar1 = local_18 != 0;
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_50,0x14beb8);
      std::__cxx11::string::c_str();
    }
    uVar4 = std::__cxx11::string::empty();
    __x = extraout_XMM0_Qa;
    if ((uVar4 & 1) == 0) {
      __x = (double)std::__cxx11::string::c_str();
    }
    debug::log(pdVar3,__x);
    if (bVar1) {
      std::__cxx11::string::~string(local_50);
    }
    local_18 = local_18 + 1;
    if (this->start != (command_node *)0x0) {
      dump(this->start,local_18);
    }
    for (local_60 = this->head; local_60 != (command_node *)0x0; local_60 = local_60->next) {
      dump(local_60,local_18);
    }
  }
  return;
}

Assistant:

void command_node::dump(size_t level)
    {
        if (LC_LOG_CHECK_LEVEL(debug::DEBUG)) {
            static std::string indent = "                                     ";
            LC_LOG_DEBUG("%s%s[%p/0x%08x/%s/%p]%s",
                level>0?indent.substr(0,level*2).c_str():"",
                part.empty()?"--ROOT--":part.c_str(),
                this,mask,hidden?"HIDDEN":"VISIBLE",cmd,
                start!=NULL?"==>":"");

            ++level;

            if (start != NULL)
                start->dump(level);

            command_node *n = head;
            while (n != NULL) {
                n->dump(level);
                n = n->next;
            }
        }
    }